

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.c
# Opt level: O0

void freeobj(lua_State *L,GCObject *o)

{
  GCObject *o_local;
  lua_State *L_local;
  
  switch(o->tt) {
  case '\x04':
    if ((o->tt & 0xf) != 4) {
      __assert_fail("(((o)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x382,"void freeobj(lua_State *, GCObject *)");
    }
    luaS_remove(L,(TString *)o);
    if ((o->tt & 0xf) != 4) {
      __assert_fail("(((o)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,899,"void freeobj(lua_State *, GCObject *)");
    }
    luaM_realloc_(L,o,(long)(int)((byte)o->field_0xb + 1) + 0x18,0);
    break;
  case '\x05':
    if (o->tt != '\x05') {
      __assert_fail("(o)->tt == 5",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x373,"void freeobj(lua_State *, GCObject *)");
    }
    luaH_free(L,(Table *)o);
    break;
  case '\x06':
    if (o->tt != '\x06') {
      __assert_fail("(o)->tt == ((6) | ((0) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x36d,"void freeobj(lua_State *, GCObject *)");
    }
    freeLclosure(L,(LClosure *)o);
    break;
  case '\a':
    if (o->tt != '\a') {
      __assert_fail("(o)->tt == 7",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x379,"void freeobj(lua_State *, GCObject *)");
    }
    luaM_realloc_(L,o,*(long *)&o[1].tt + 0x28,0);
    break;
  case '\b':
    if (o->tt != '\b') {
      __assert_fail("(o)->tt == 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x376,"void freeobj(lua_State *, GCObject *)");
    }
    luaE_freethread(L,(lua_State *)o);
    break;
  case '\t':
    if (o->tt != '\t') {
      __assert_fail("(o)->tt == 9",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x36a,"void freeobj(lua_State *, GCObject *)");
    }
    luaF_freeproto(L,(Proto *)o);
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                  ,0x389,"void freeobj(lua_State *, GCObject *)");
  case '\x14':
    if ((o->tt & 0xf) != 4) {
      __assert_fail("(((o)->tt) & 0x0F) == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x386,"void freeobj(lua_State *, GCObject *)");
    }
    luaM_realloc_(L,o,(size_t)&o[1].next[1].marked,0);
    break;
  case '\x15':
  case '%':
    if ((o->tt != '\x15') && (o->tt != '%')) {
      __assert_fail("((o)->tt == ((5) | ((1) << 4)) || (o)->tt == ((5) | ((2) << 4)))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x37f,"void freeobj(lua_State *, GCObject *)");
    }
    raviH_free(L,(RaviArray *)o);
    break;
  case '&':
    if (o->tt != '&') {
      __assert_fail("(o)->tt == ((6) | ((2) << 4))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lgc.c"
                    ,0x370,"void freeobj(lua_State *, GCObject *)");
    }
    luaM_realloc_(L,o,(long)(int)(((byte)o->field_0xa - 1) * 0x10 + 0x30),0);
  }
  return;
}

Assistant:

static void freeobj(lua_State *L, GCObject *o) {
  switch (o->tt) {
    case LUA_TPROTO:
      luaF_freeproto(L, gco2p(o));
      break;
    case LUA_TLCL:
      freeLclosure(L, gco2lcl(o));
      break;
    case LUA_TCCL:
      luaM_freemem(L, o, sizeCclosure(gco2ccl(o)->nupvalues));
      break;
    case LUA_TTABLE:
      luaH_free(L, gco2t(o));
      break;
    case LUA_TTHREAD:
      luaE_freethread(L, gco2th(o));
      break;
    case LUA_TUSERDATA:
      luaM_freemem(L, o, sizeudata(gco2u(o)));
      break;

    /* RAVI changes */
    case RAVI_TFARRAY:
    case RAVI_TIARRAY:
      raviH_free(L, gco2array(o));
      break;
    case LUA_TSHRSTR:
      luaS_remove(L, gco2ts(o)); /* remove it from hash table */
      luaM_freemem(L, o, sizelstring(gco2ts(o)->shrlen));
      break;
    case LUA_TLNGSTR:
      luaM_freemem(L, o, sizelstring(gco2ts(o)->u.lnglen));
      break;
    default:
      lua_assert(0);
  }
}